

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest40(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Application *pAVar1;
  FieldBase local_228;
  FieldBase local_1d0;
  FieldBase local_178;
  FieldBase local_120;
  FieldBase local_c8;
  FieldBase local_70;
  
  pAVar1 = this;
  queryOrigClOrdID((OrigClOrdID *)&local_c8,this);
  queryClOrdID((ClOrdID *)&local_120,pAVar1);
  pAVar1 = (Application *)0x7d;
  FIX::CharField::CharField((CharField *)&local_228,0x7d,'F');
  local_228._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00162288;
  querySymbol((Symbol *)&local_178,pAVar1);
  querySide((Side *)&local_1d0,pAVar1);
  queryOrderQty((OrderQty *)&local_70,pAVar1);
  FIX40::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,(OrigClOrdID *)&local_c8,(ClOrdID *)&local_120,
             (CxlType *)&local_228,(Symbol *)&local_178,(Side *)&local_1d0,(OrderQty *)&local_70);
  FIX::FieldBase::~FieldBase(&local_70);
  FIX::FieldBase::~FieldBase(&local_1d0);
  FIX::FieldBase::~FieldBase(&local_178);
  FIX::FieldBase::~FieldBase(&local_228);
  FIX::FieldBase::~FieldBase(&local_120);
  FIX::FieldBase::~FieldBase(&local_c8);
  queryHeader(this,(Header *)&(__return_storage_ptr__->super_Message).field_0x70);
  return __return_storage_ptr__;
}

Assistant:

FIX40::OrderCancelRequest Application::queryOrderCancelRequest40() {
  FIX40::OrderCancelRequest orderCancelRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::CxlType('F'),
      querySymbol(),
      querySide(),
      queryOrderQty());

  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}